

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperSTREQ
          (internal *this,char *expected_expression,char *actual_expression,wchar_t *expected,
          wchar_t *actual)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  AssertionResult AVar3;
  String local_48;
  String local_38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  if (actual == (wchar_t *)0x0 || expected == (wchar_t *)0x0) {
    sVar2.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 actual_expression;
    if (expected != (wchar_t *)0x0 || actual != (wchar_t *)0x0) {
LAB_0011b72f:
      String::ShowWideCStringQuoted(&local_38,expected);
      String::ShowWideCStringQuoted(&local_48,actual);
      AVar3 = EqFailure(this,expected_expression,actual_expression,&local_38,&local_48,false);
      sVar2 = AVar3.message_.ptr_;
      if (local_48.c_str_ != (char *)0x0) {
        operator_delete__(local_48.c_str_);
        sVar2.ptr_ = extraout_RDX_00;
      }
      if (local_38.c_str_ != (char *)0x0) {
        operator_delete__(local_38.c_str_);
        sVar2.ptr_ = extraout_RDX_01;
      }
      goto LAB_0011b77d;
    }
  }
  else {
    iVar1 = wcscmp(expected,actual);
    sVar2.ptr_ = extraout_RDX;
    if (iVar1 != 0) goto LAB_0011b72f;
  }
  *this = (internal)0x1;
  *(undefined8 *)(this + 8) = 0;
LAB_0011b77d:
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperSTREQ(const char* expected_expression,
                               const char* actual_expression,
                               const wchar_t* expected,
                               const wchar_t* actual) {
  if (String::WideCStringEquals(expected, actual)) {
    return AssertionSuccess();
  }

  return EqFailure(expected_expression,
                   actual_expression,
                   String::ShowWideCStringQuoted(expected),
                   String::ShowWideCStringQuoted(actual),
                   false);
}